

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_timer.c
# Opt level: O3

int settime_fails(int fd,int flags,itimerspec *new_value,itimerspec *old_value)

{
  int *piVar1;
  
  piVar1 = __errno_location();
  *piVar1 = 0x16;
  return -1;
}

Assistant:

static int settime_fails(int fd, int flags, const struct itimerspec *new_value, struct itimerspec *old_value)
{
	(void)fd;
	(void)flags;
	(void)new_value;
	(void)old_value;

	errno = EINVAL;
	return -1;
}